

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O3

void __thiscall embree::Scene::createHairAccel(Scene *this)

{
  long lVar1;
  State *this_00;
  bool bVar2;
  int iVar3;
  undefined8 *puVar4;
  Accel *accel;
  RTCSceneFlags RVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  iVar3 = std::__cxx11::string::compare
                    ((char *)(*(long *)&(this->super_AccelN).field_0x188 + 0x250));
  if (iVar3 != 0) {
    iVar3 = std::__cxx11::string::compare
                      ((char *)(*(long *)&(this->super_AccelN).field_0x188 + 0x250));
    lVar1 = *(long *)&(this->super_AccelN).field_0x188;
    if (iVar3 == 0) {
      accel = BVH4Factory::BVH4OBBVirtualCurve4v(*(BVH4Factory **)(lVar1 + 0x560),this,FAST);
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)(lVar1 + 0x250));
      lVar1 = *(long *)&(this->super_AccelN).field_0x188;
      if (iVar3 == 0) {
        accel = BVH4Factory::BVH4OBBVirtualCurve4i(*(BVH4Factory **)(lVar1 + 0x560),this,FAST);
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)(lVar1 + 0x250));
        lVar1 = *(long *)&(this->super_AccelN).field_0x188;
        if (iVar3 == 0) {
          accel = BVH8Factory::BVH8OBBVirtualCurve8v(*(BVH8Factory **)(lVar1 + 0x568),this,FAST);
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)(lVar1 + 0x250));
          if (iVar3 != 0) {
            puVar4 = (undefined8 *)__cxa_allocate_exception(0x30);
            std::operator+(&local_38,"unknown hair acceleration structure ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (*(long *)&(this->super_AccelN).field_0x188 + 0x250));
            *puVar4 = &PTR__rtcore_error_02184a18;
            *(undefined4 *)(puVar4 + 1) = 2;
            puVar4[2] = puVar4 + 4;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)(puVar4 + 2),local_38._M_dataplus._M_p,
                       local_38._M_dataplus._M_p + local_38._M_string_length);
            __cxa_throw(puVar4,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
          }
          accel = BVH4Factory::BVH4OBBVirtualCurve8i
                            (*(BVH4Factory **)(*(long *)&(this->super_AccelN).field_0x188 + 0x560),
                             this,FAST);
        }
      }
    }
    AccelN::accels_add(&this->super_AccelN,accel);
    return;
  }
  RVar5 = this->scene_flags >> 2 & RTC_SCENE_FLAG_DYNAMIC |
          this->scene_flags & RTC_SCENE_FLAG_COMPACT;
  this_00 = *(State **)&(this->super_AccelN).field_0x188;
  bVar2 = State::hasISA(this_00,0x6007dff);
  if ((bVar2) && (this_00->frequency_level != FREQUENCY_SIMD128)) {
    (*(code *)(&DAT_01f7ebb0 + *(int *)(&DAT_01f7ebb0 + (ulong)RVar5 * 4)))();
    return;
  }
  (*(code *)(&DAT_01f7eba0 + *(int *)(&DAT_01f7eba0 + (ulong)RVar5 * 4)))();
  return;
}

Assistant:

void Scene::createHairAccel()
  {
#if defined(EMBREE_GEOMETRY_CURVE) || defined(EMBREE_GEOMETRY_POINT)

    if (device->hair_accel == "default")
    {
      int mode = 2*(int)isCompactAccel() + 1*(int)isRobustAccel();
#if defined (EMBREE_TARGET_SIMD8)
      if (device->canUseAVX2()) // only enable on HSW machines, for SNB this codepath is slower
      {
        switch (mode) {
        case /*0b00*/ 0: accels_add(device->bvh8_factory->BVH8OBBVirtualCurve8v(this,BVHFactory::IntersectVariant::FAST)); break;
        case /*0b01*/ 1: accels_add(device->bvh8_factory->BVH8OBBVirtualCurve8v(this,BVHFactory::IntersectVariant::ROBUST)); break;
        case /*0b10*/ 2: accels_add(device->bvh4_factory->BVH4OBBVirtualCurve8i(this,BVHFactory::IntersectVariant::FAST)); break;
        case /*0b11*/ 3: accels_add(device->bvh4_factory->BVH4OBBVirtualCurve8i(this,BVHFactory::IntersectVariant::ROBUST)); break;
        }
      }
      else
#endif
      {
        switch (mode) {
        case /*0b00*/ 0: accels_add(device->bvh4_factory->BVH4OBBVirtualCurve4v(this,BVHFactory::IntersectVariant::FAST)); break;
        case /*0b01*/ 1: accels_add(device->bvh4_factory->BVH4OBBVirtualCurve4v(this,BVHFactory::IntersectVariant::ROBUST)); break;
        case /*0b10*/ 2: accels_add(device->bvh4_factory->BVH4OBBVirtualCurve4i(this,BVHFactory::IntersectVariant::FAST)); break;
        case /*0b11*/ 3: accels_add(device->bvh4_factory->BVH4OBBVirtualCurve4i(this,BVHFactory::IntersectVariant::ROBUST)); break;
        }
      }
    }
    else if (device->hair_accel == "bvh4obb.virtualcurve4v" ) accels_add(device->bvh4_factory->BVH4OBBVirtualCurve4v(this,BVHFactory::IntersectVariant::FAST));
    else if (device->hair_accel == "bvh4obb.virtualcurve4i" ) accels_add(device->bvh4_factory->BVH4OBBVirtualCurve4i(this,BVHFactory::IntersectVariant::FAST));
#if defined (EMBREE_TARGET_SIMD8)
    else if (device->hair_accel == "bvh8obb.virtualcurve8v" ) accels_add(device->bvh8_factory->BVH8OBBVirtualCurve8v(this,BVHFactory::IntersectVariant::FAST));
    else if (device->hair_accel == "bvh4obb.virtualcurve8i" ) accels_add(device->bvh4_factory->BVH4OBBVirtualCurve8i(this,BVHFactory::IntersectVariant::FAST));
#endif
    else throw_RTCError(RTC_ERROR_INVALID_ARGUMENT,"unknown hair acceleration structure "+device->hair_accel);
#endif
  }